

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O1

void platform_get_x11_auth(X11Display *disp,Conf *conf)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = getenv("XAUTHORITY");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = getenv("HOME");
    if (pcVar2 != (char *)0x0) {
      pcVar2 = dupcat_fn(pcVar2,"/.Xauthority",0);
      bVar1 = true;
      goto LAB_0014ac7d;
    }
    pcVar2 = (char *)0x0;
  }
  bVar1 = false;
LAB_0014ac7d:
  if ((pcVar2 != (char *)0x0) && (x11_get_auth_from_authfile(disp,pcVar2), bVar1)) {
    safefree(pcVar2);
    return;
  }
  return;
}

Assistant:

void platform_get_x11_auth(struct X11Display *disp, Conf *conf)
{
    char *xauthfile;
    bool needs_free;

    /*
     * Find the .Xauthority file.
     */
    needs_free = false;
    xauthfile = getenv("XAUTHORITY");
    if (!xauthfile) {
        xauthfile = getenv("HOME");
        if (xauthfile) {
            xauthfile = dupcat(xauthfile, "/.Xauthority");
            needs_free = true;
        }
    }

    if (xauthfile) {
        x11_get_auth_from_authfile(disp, xauthfile);
        if (needs_free)
            sfree(xauthfile);
    }
}